

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,cs_impl::any>::
     construct<std::allocator<std::pair<std::__cxx11::string_const,cs_impl::any>>,std::pair<std::__cxx11::string_const,cs_impl::any>const&>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
                *alloc,slot_type *slot,
               pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
               *args)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
  *in_RSI;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  ::emplace((slot_type *)0x4228ac);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,cs_impl::any>>>::
  construct<std::pair<std::__cxx11::string,cs_impl::any>,std::pair<std::__cxx11::string_const,cs_impl::any>const&>
            (in_RSI,in_RDX,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
              *)0x4228bf);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}